

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void cmSourceFileSetName(void *arg,char *name,char *dir,int numSourceExtensions,
                        char **sourceExtensions,int numHeaderExtensions,char **headerExtensions)

{
  string *this;
  pointer pcVar1;
  char *pcVar2;
  void *pvVar3;
  char *pcVar4;
  bool bVar5;
  long lVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceExts;
  string pathname;
  ostringstream e;
  allocator local_261;
  long *local_260 [2];
  long local_250 [2];
  string local_240;
  void *local_220;
  char *local_218;
  uint local_20c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  string local_1d0;
  char *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (*arg == 0) {
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_220 = arg;
    local_218 = name;
    local_20c = numHeaderExtensions;
    local_1b0 = dir;
    if (0 < numSourceExtensions) {
      uVar8 = 0;
      do {
        std::__cxx11::string::string
                  ((string *)local_1a8,sourceExtensions[uVar8],(allocator *)&local_1d0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        uVar8 = uVar8 + 1;
      } while ((uint)numSourceExtensions != uVar8);
    }
    if (0 < (int)local_20c) {
      uVar8 = (ulong)local_20c;
      uVar9 = 0;
      do {
        std::__cxx11::string::string
                  ((string *)local_1a8,headerExtensions[uVar9],(allocator *)&local_1d0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    pcVar4 = local_218;
    pvVar3 = local_220;
    this = (string *)((long)local_220 + 8);
    pcVar2 = *(char **)((long)local_220 + 0x10);
    strlen(local_218);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)pcVar4);
    std::__cxx11::string::string((string *)local_1a8,pcVar4,(allocator *)local_260);
    cmsys::SystemTools::CollapseFullPath(&local_1d0,(string *)local_1a8,local_1b0);
    pcVar1 = local_1a8 + 0x10;
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_260[0] = local_250;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_260,local_1d0._M_dataplus._M_p,
               local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
    bVar5 = cmsys::SystemTools::FileExists((char *)local_260[0]);
    if (bVar5) {
      std::__cxx11::string::string((string *)&local_240,pcVar4,&local_261);
      cmsys::SystemTools::GetFilenamePath((string *)local_1a8,&local_240);
      std::__cxx11::string::operator=(this,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      pcVar2 = local_218;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if (*(long *)((long)pvVar3 + 0x10) != 0) {
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::string((string *)&local_240,pcVar2,&local_261);
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_1a8,&local_240);
      std::__cxx11::string::_M_append((char *)this,local_1a8._0_8_);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      lVar6 = std::__cxx11::string::rfind((char)local_260,0x2e);
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_260);
        std::__cxx11::string::operator=((string *)((long)pvVar3 + 0x28),(string *)local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        bVar5 = cmsys::SystemTools::FileIsFullPath(local_218);
        if (bVar5) {
          lVar6 = std::__cxx11::string::rfind((char)local_260,0x2f);
          if (lVar6 != -1) {
            std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_260);
            std::__cxx11::string::operator=(this,(string *)local_1a8);
            if ((pointer)local_1a8._0_8_ != pcVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
          }
        }
      }
      std::__cxx11::string::_M_assign((string *)((long)pvVar3 + 0x48));
    }
    else {
      if (local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar10 = local_1e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__cxx11::string::_M_assign((string *)local_260);
          std::__cxx11::string::append((char *)local_260);
          std::__cxx11::string::_M_append((char *)local_260,(ulong)(pbVar10->_M_dataplus)._M_p);
          bVar5 = cmsys::SystemTools::FileExists((char *)local_260[0]);
          pvVar3 = local_220;
          if (bVar5) {
            std::__cxx11::string::_M_assign((string *)((long)local_220 + 0x28));
            std::__cxx11::string::_M_assign((string *)((long)pvVar3 + 0x48));
            goto LAB_0039ac21;
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar10 = local_208.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__cxx11::string::_M_assign((string *)local_260);
          std::__cxx11::string::append((char *)local_260);
          std::__cxx11::string::_M_append((char *)local_260,(ulong)(pbVar10->_M_dataplus)._M_p);
          bVar5 = cmsys::SystemTools::FileExists((char *)local_260[0]);
          pvVar3 = local_220;
          if (bVar5) {
            std::__cxx11::string::_M_assign((string *)((long)local_220 + 0x28));
            std::__cxx11::string::_M_assign((string *)((long)pvVar3 + 0x48));
            goto LAB_0039ac21;
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Cannot find source file \"",0x19);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1d0._M_dataplus._M_p,local_1d0._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"\n\nTried extensions",0x12);
      if (local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar10 = local_1e8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_208.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar10 = local_208.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," .",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 !=
                 local_208.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(local_240._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
LAB_0039ac21:
    if (local_260[0] != local_250) {
      operator_delete(local_260[0],local_250[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_208);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8);
  }
  return;
}

Assistant:

void CCONV cmSourceFileSetName(void *arg, const char* name, const char* dir,
                               int numSourceExtensions,
                               const char **sourceExtensions,
                               int numHeaderExtensions,
                               const char **headerExtensions)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if(sf->RealSourceFile)
    {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
    }
  std::vector<std::string> sourceExts;
  std::vector<std::string> headerExts;
  int i;
  for (i = 0; i < numSourceExtensions; ++i)
    {
    sourceExts.push_back(sourceExtensions[i]);
    }
  for (i = 0; i < numHeaderExtensions; ++i)
    {
    headerExts.push_back(headerExtensions[i]);
    }

  // Save the original name given.
  sf->SourceName = name;

  // Convert the name to a full path in case the given name is a
  // relative path.
  std::string pathname = cmSystemTools::CollapseFullPath(name, dir);

  // First try and see whether the listed file can be found
  // as is without extensions added on.
  std::string hname = pathname;
  if(cmSystemTools::FileExists(hname.c_str()))
    {
    sf->SourceName = cmSystemTools::GetFilenamePath(name);
    if ( sf->SourceName.size() > 0 )
      {
      sf->SourceName += "/";
      }
    sf->SourceName += cmSystemTools::GetFilenameWithoutLastExtension(name);
    std::string::size_type pos = hname.rfind('.');
    if(pos != std::string::npos)
      {
      sf->SourceExtension = hname.substr(pos+1, hname.size()-pos);
      if ( cmSystemTools::FileIsFullPath(name) )
        {
        std::string::size_type pos2 = hname.rfind('/');
        if(pos2 != std::string::npos)
          {
          sf->SourceName = hname.substr(pos2+1, pos - pos2-1);
          }
        }
      }

    sf->FullPath = hname;
    return;
    }

  // Next, try the various source extensions
  for( std::vector<std::string>::const_iterator ext = sourceExts.begin();
       ext != sourceExts.end(); ++ext )
    {
    hname = pathname;
    hname += ".";
    hname += *ext;
    if(cmSystemTools::FileExists(hname.c_str()))
      {
      sf->SourceExtension = *ext;
      sf->FullPath = hname;
      return;
      }
    }

  // Finally, try the various header extensions
  for( std::vector<std::string>::const_iterator ext = headerExts.begin();
       ext != headerExts.end(); ++ext )
    {
    hname = pathname;
    hname += ".";
    hname += *ext;
    if(cmSystemTools::FileExists(hname.c_str()))
      {
      sf->SourceExtension = *ext;
      sf->FullPath = hname;
      return;
      }
    }

  std::ostringstream e;
  e << "Cannot find source file \"" << pathname << "\"";
  e << "\n\nTried extensions";
  for( std::vector<std::string>::const_iterator ext = sourceExts.begin();
       ext != sourceExts.end(); ++ext )
    {
    e << " ." << *ext;
    }
  for( std::vector<std::string>::const_iterator ext = headerExts.begin();
       ext != headerExts.end(); ++ext )
    {
    e << " ." << *ext;
    }
  cmSystemTools::Error(e.str().c_str());
  return;
}